

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O3

NaVector * __thiscall NaVector::shift(NaVector *this,int iOffset)

{
  int iVar1;
  int iVar2;
  NaReal *pNVar3;
  long lVar4;
  
  iVar1 = (*this->_vptr_NaVector[6])();
  if ((iOffset < iVar1) && (iVar1 = (*this->_vptr_NaVector[6])(this), -iVar1 < iOffset)) {
    if (iOffset < 1) {
      if (iOffset < 0) {
        iVar1 = (*this->_vptr_NaVector[6])(this);
        if (iVar1 + iOffset != 0 && SCARRY4(iVar1,iOffset) == iVar1 + iOffset < 0) {
          lVar4 = 0;
          do {
            this->pVect[lVar4] = this->pVect[lVar4 - iOffset];
            lVar4 = lVar4 + 1;
            iVar1 = (*this->_vptr_NaVector[6])(this);
          } while (lVar4 < iVar1 + iOffset);
        }
        iVar1 = (*this->_vptr_NaVector[6])(this);
        iVar2 = (*this->_vptr_NaVector[6])(this);
        if (iVar1 + iOffset < iVar2) {
          lVar4 = (long)(iVar1 + iOffset);
          do {
            this->pVect[lVar4] = 0.0;
            lVar4 = lVar4 + 1;
            iVar1 = (*this->_vptr_NaVector[6])(this);
          } while (lVar4 < iVar1);
        }
      }
    }
    else {
      iVar1 = (*this->_vptr_NaVector[6])(this);
      if (-1 < ~iOffset + iVar1) {
        pNVar3 = this->pVect + (uint)(~iOffset + iVar1);
        iVar1 = iVar1 - iOffset;
        do {
          pNVar3[(uint)iOffset] = *pNVar3;
          pNVar3 = pNVar3 + -1;
          iVar1 = iVar1 + -1;
        } while (0 < iVar1);
      }
      memset(this->pVect,0,(ulong)(uint)iOffset << 3);
    }
  }
  else {
    (*this->_vptr_NaVector[0xd])(this);
  }
  return this;
}

Assistant:

NaVector&
NaVector::shift (int iOffset)
{
    int i;

    if(iOffset >= (int)dim() ||
       iOffset <= - (int)dim()){
       init_zero();
    }else if(iOffset > 0){
        for(i = dim() - iOffset - 1; i >= 0; --i){
            pVect[i + iOffset] = pVect[i];
        }
        for(i = 0; i < iOffset; ++i){
            pVect[i] = 0.0;
        }
    }else if(iOffset < 0){
        for(i = 0; i < (int)dim() + iOffset; ++i){
            pVect[i] = pVect[i - iOffset];
        }
        for(i = dim() + iOffset; i < (int)dim(); ++i){
            pVect[i] = 0.0;
        }
    }
    // else
    //   iOffset == 0
    
    return *this;
}